

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmGraphicsShaderTestUtil.cpp
# Opt level: O2

void vkt::SpirVAssembly::createPipelineShaderStages
               (DeviceInterface *vk,VkDevice vkDevice,InstanceContext *instance,Context *context,
               vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
               *modules,vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
                        *createInfos)

{
  Unique<vk::Handle<(vk::HandleType)14>_> *ptr;
  ProgramBinary *binary;
  _Base_ptr p_Var1;
  EntryToStage *stage;
  _Base_ptr p_Var2;
  VkPipelineShaderStageCreateInfo shaderParam;
  ModuleHandleSp mod;
  
  for (p_Var1 = (instance->moduleMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(instance->moduleMap)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    ptr = (Unique<vk::Handle<(vk::HandleType)14>_> *)operator_new(0x20);
    binary = ::vk::ProgramCollection<vk::ProgramBinary>::get
                       (context->m_progCollection,(string *)(p_Var1 + 1));
    ::vk::createShaderModule
              ((Move<vk::Handle<(vk::HandleType)14>_> *)&shaderParam,vk,vkDevice,binary,0);
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_device =
         (VkDevice)shaderParam._16_8_;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)shaderParam.module.m_internal;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal =
         shaderParam._0_8_;
    (ptr->super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.deleter.m_deviceIface =
         (DeviceInterface *)shaderParam.pNext;
    shaderParam.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    shaderParam._4_4_ = 0;
    shaderParam.pNext = (void *)0x0;
    shaderParam.flags = 0;
    shaderParam.stage = 0;
    shaderParam.module.m_internal = 0;
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::SharedPtr(&mod,ptr);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)14>_> *)&shaderParam);
    shaderParam._0_8_ = mod.m_ptr;
    shaderParam.pNext = mod.m_state;
    if (mod.m_state != (SharedPtrStateBase *)0x0) {
      LOCK();
      (mod.m_state)->strongRefCount = (mod.m_state)->strongRefCount + 1;
      UNLOCK();
      LOCK();
      (mod.m_state)->weakRefCount = (mod.m_state)->weakRefCount + 1;
      UNLOCK();
    }
    std::
    vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>>
    ::emplace_back<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>
              ((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>,std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>>>>>
                *)modules,
               (SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)&shaderParam);
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::~SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_> *)&shaderParam);
    for (p_Var2 = *(_Base_ptr *)(p_Var1 + 2); p_Var2 != p_Var1[2]._M_parent;
        p_Var2 = (_Base_ptr)&p_Var2[1]._M_parent) {
      shaderParam.sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
      shaderParam.pNext = (void *)0x0;
      shaderParam._16_8_ = (ulong)p_Var2[1]._M_color << 0x20;
      shaderParam.module.m_internal =
           (((modules->
             super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish[-1].m_ptr)->
           super_RefBase<vk::Handle<(vk::HandleType)14>_>).m_data.object.m_internal;
      shaderParam.pName = *(char **)p_Var2;
      shaderParam.pSpecializationInfo = (VkSpecializationInfo *)0x0;
      std::
      vector<vk::VkPipelineShaderStageCreateInfo,_std::allocator<vk::VkPipelineShaderStageCreateInfo>_>
      ::push_back(createInfos,&shaderParam);
    }
    de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)14>_>_>::~SharedPtr(&mod);
  }
  return;
}

Assistant:

void createPipelineShaderStages (const DeviceInterface&						vk,
								 const VkDevice								vkDevice,
								 InstanceContext&							instance,
								 Context&									context,
								 vector<ModuleHandleSp>&					modules,
								 vector<VkPipelineShaderStageCreateInfo>&	createInfos)
{
	for (ModuleMap::const_iterator moduleNdx = instance.moduleMap.begin(); moduleNdx != instance.moduleMap.end(); ++moduleNdx)
	{
		const ModuleHandleSp mod(new Unique<VkShaderModule>(createShaderModule(vk, vkDevice, context.getBinaryCollection().get(moduleNdx->first), 0)));
		modules.push_back(ModuleHandleSp(mod));
		for (vector<EntryToStage>::const_iterator shaderNdx = moduleNdx->second.begin(); shaderNdx != moduleNdx->second.end(); ++shaderNdx)
		{
			const EntryToStage&						stage			= *shaderNdx;
			const VkPipelineShaderStageCreateInfo	shaderParam		=
			{
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	//	VkStructureType			sType;
				DE_NULL,												//	const void*				pNext;
				(VkPipelineShaderStageCreateFlags)0,
				stage.second,											//	VkShaderStageFlagBits	stage;
				**modules.back(),										//	VkShaderModule			module;
				stage.first.c_str(),									//	const char*				pName;
				(const VkSpecializationInfo*)DE_NULL,
			};
			createInfos.push_back(shaderParam);
		}
	}
}